

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashedSimplePairCache.cpp
# Opt level: O3

void * __thiscall
btHashedSimplePairCache::removeOverlappingPair(btHashedSimplePairCache *this,int indexA,int indexB)

{
  long lVar1;
  btSimplePair *pbVar2;
  int *piVar3;
  btSimplePair *pbVar4;
  int *piVar5;
  void *pvVar6;
  anon_union_8_2_fce4e415_for_btSimplePair_2 aVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  
  gRemoveSimplePairs = gRemoveSimplePairs + 1;
  uVar8 = indexB << 0x10 | indexA;
  uVar8 = ~(uVar8 << 0xf) + uVar8;
  uVar8 = ((int)uVar8 >> 10 ^ uVar8) * 9;
  uVar8 = (int)uVar8 >> 6 ^ uVar8;
  uVar8 = ~(uVar8 << 0xb) + uVar8;
  uVar14 = (long)(int)((int)uVar8 >> 0x10 ^ uVar8) &
           (long)(this->m_overlappingPairArray).m_capacity - 1U;
  piVar3 = (this->m_hashTable).m_data;
  iVar13 = piVar3[uVar14];
  if (iVar13 == -1) {
    return (void *)0x0;
  }
  pbVar4 = (this->m_overlappingPairArray).m_data;
  piVar5 = (this->m_next).m_data;
  iVar9 = iVar13;
  while ((pbVar4[iVar9].m_indexA != indexA || (pbVar4[iVar9].m_indexB != indexB))) {
    iVar9 = piVar5[iVar9];
    if (iVar9 == -1) {
      return (void *)0x0;
    }
  }
  pvVar6 = pbVar4[iVar9].field_2.m_userPointer;
  if (iVar13 == iVar9) {
LAB_00155ca9:
    piVar3[uVar14] = piVar5[iVar9];
  }
  else {
    do {
      iVar11 = iVar13;
      iVar13 = piVar5[iVar11];
    } while (piVar5[iVar11] != iVar9);
    if (iVar11 == -1) goto LAB_00155ca9;
    piVar5[iVar11] = piVar5[iVar9];
  }
  lVar10 = (long)(this->m_overlappingPairArray).m_size;
  lVar1 = lVar10 + -1;
  iVar13 = (int)lVar1;
  if (iVar13 == iVar9) goto LAB_00155d73;
  pbVar2 = pbVar4 + lVar1;
  uVar8 = pbVar4[lVar1].m_indexB << 0x10 | pbVar4[lVar1].m_indexA;
  uVar8 = ~(uVar8 << 0xf) + uVar8;
  uVar8 = ((int)uVar8 >> 10 ^ uVar8) * 9;
  uVar8 = (int)uVar8 >> 6 ^ uVar8;
  uVar8 = ~(uVar8 << 0xb) + uVar8;
  uVar14 = (long)(int)((int)uVar8 >> 0x10 ^ uVar8) &
           (long)(this->m_overlappingPairArray).m_capacity - 1U;
  iVar11 = piVar3[uVar14];
  if (piVar3[uVar14] == iVar13) {
LAB_00155d49:
    piVar3[uVar14] = piVar5[lVar10 + -1];
  }
  else {
    do {
      iVar12 = iVar11;
      iVar11 = piVar5[iVar12];
    } while (piVar5[iVar12] != iVar13);
    if (iVar12 == -1) goto LAB_00155d49;
    piVar5[iVar12] = piVar5[lVar10 + -1];
  }
  iVar13 = pbVar2->m_indexB;
  aVar7 = pbVar2->field_2;
  pbVar4 = pbVar4 + iVar9;
  pbVar4->m_indexA = pbVar2->m_indexA;
  pbVar4->m_indexB = iVar13;
  pbVar4->field_2 = aVar7;
  piVar3 = (this->m_hashTable).m_data;
  (this->m_next).m_data[iVar9] = piVar3[uVar14];
  piVar3[uVar14] = iVar9;
  iVar9 = (this->m_overlappingPairArray).m_size + -1;
LAB_00155d73:
  (this->m_overlappingPairArray).m_size = iVar9;
  return pvVar6;
}

Assistant:

void* btHashedSimplePairCache::removeOverlappingPair(int indexA, int indexB)
{
	gRemoveSimplePairs++;
	

	/*if (indexA > indexB) 
		btSwap(indexA, indexB);*/

	int	hash = static_cast<int>(getHash(static_cast<unsigned int>(indexA),static_cast<unsigned int>(indexB)) & (m_overlappingPairArray.capacity()-1));

	btSimplePair* pair = internalFindPair(indexA, indexB, hash);
	if (pair == NULL)
	{
		return 0;
	}

	
	void* userData = pair->m_userPointer;


	int pairIndex = int(pair - &m_overlappingPairArray[0]);
	btAssert(pairIndex < m_overlappingPairArray.size());

	// Remove the pair from the hash table.
	int index = m_hashTable[hash];
	btAssert(index != BT_SIMPLE_NULL_PAIR);

	int previous = BT_SIMPLE_NULL_PAIR;
	while (index != pairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_SIMPLE_NULL_PAIR)
	{
		btAssert(m_next[previous] == pairIndex);
		m_next[previous] = m_next[pairIndex];
	}
	else
	{
		m_hashTable[hash] = m_next[pairIndex];
	}

	// We now move the last pair into spot of the
	// pair being removed. We need to fix the hash
	// table indices to support the move.

	int lastPairIndex = m_overlappingPairArray.size() - 1;

	// If the removed pair is the last pair, we are done.
	if (lastPairIndex == pairIndex)
	{
		m_overlappingPairArray.pop_back();
		return userData;
	}

	// Remove the last pair from the hash table.
	const btSimplePair* last = &m_overlappingPairArray[lastPairIndex];
		/* missing swap here too, Nat. */ 
	int lastHash = static_cast<int>(getHash(static_cast<unsigned int>(last->m_indexA), static_cast<unsigned int>(last->m_indexB)) & (m_overlappingPairArray.capacity()-1));

	index = m_hashTable[lastHash];
	btAssert(index != BT_SIMPLE_NULL_PAIR);

	previous = BT_SIMPLE_NULL_PAIR;
	while (index != lastPairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_SIMPLE_NULL_PAIR)
	{
		btAssert(m_next[previous] == lastPairIndex);
		m_next[previous] = m_next[lastPairIndex];
	}
	else
	{
		m_hashTable[lastHash] = m_next[lastPairIndex];
	}

	// Copy the last pair into the remove pair's spot.
	m_overlappingPairArray[pairIndex] = m_overlappingPairArray[lastPairIndex];

	// Insert the last pair into the hash table
	m_next[pairIndex] = m_hashTable[lastHash];
	m_hashTable[lastHash] = pairIndex;

	m_overlappingPairArray.pop_back();

	return userData;
}